

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::TextTrieMap::buildTrie(TextTrieMap *this,UErrorCode *status)

{
  int32_t iVar1;
  char16_t *p;
  ConstChar16Ptr local_78;
  undefined1 local_70 [8];
  UnicodeString keyString;
  void *val;
  UChar *key;
  int32_t i;
  UErrorCode *status_local;
  TextTrieMap *this_local;
  
  if (this->fLazyContents != (UVector *)0x0) {
    key._4_4_ = 0;
    while( true ) {
      iVar1 = UVector::size(this->fLazyContents);
      if (iVar1 <= key._4_4_) break;
      p = (char16_t *)UVector::elementAt(this->fLazyContents,key._4_4_);
      keyString.fUnion._48_8_ = UVector::elementAt(this->fLazyContents,key._4_4_ + 1);
      ConstChar16Ptr::ConstChar16Ptr(&local_78,p);
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70,'\x01',&local_78,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_78);
      putImpl(this,(UnicodeString *)local_70,(void *)keyString.fUnion._48_8_,status);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
      key._4_4_ = key._4_4_ + 2;
    }
    if (this->fLazyContents != (UVector *)0x0) {
      (*(this->fLazyContents->super_UObject)._vptr_UObject[1])();
    }
    this->fLazyContents = (UVector *)0x0;
  }
  return;
}

Assistant:

void TextTrieMap::buildTrie(UErrorCode &status) {
    if (fLazyContents != NULL) {
        for (int32_t i=0; i<fLazyContents->size(); i+=2) {
            const UChar *key = (UChar *)fLazyContents->elementAt(i);
            void  *val = fLazyContents->elementAt(i+1);
            UnicodeString keyString(TRUE, key, -1);  // Aliasing UnicodeString constructor.
            putImpl(keyString, val, status);
        }
        delete fLazyContents;
        fLazyContents = NULL; 
    }
}